

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSingle.c
# Opt level: O2

void Fxu_MatrixComputeSingles(Fxu_Matrix *p,int fUse0,int nSingleMax)

{
  int i;
  Fxu_Var **ppFVar1;
  Fxu_Lit *pFVar2;
  int iVar3;
  uint uVar4;
  Fxu_Matrix *p_00;
  Fxu_Cube *pFVar5;
  Fxu_ListLit *pFVar6;
  void *pvVar7;
  void *pvVar8;
  Fxu_Var *pFVar9;
  Fxu_Var *pFVar10;
  Fxu_Var **ppFVar11;
  long lVar12;
  Fxu_Lit *pFVar13;
  int iVar14;
  int i_00;
  Fxu_Matrix *p_01;
  Fxu_ListVar *pFVar15;
  int i_01;
  uint local_40;
  
  p->nWeightLimit = 1 - fUse0;
  p_00 = (Fxu_Matrix *)malloc(0x10);
  (p_00->lCubes).pHead = (Fxu_Cube *)0x2710;
  p_01 = (Fxu_Matrix *)0x13880;
  pFVar5 = (Fxu_Cube *)malloc(80000);
  (p_00->lCubes).pTail = pFVar5;
  ppFVar1 = &p->pOrderVars;
  pFVar15 = &p->lVars;
  while (pFVar9 = pFVar15->pHead, pFVar9 != (Fxu_Var *)0x0) {
    p->ppTailVars = ppFVar1;
    p->pOrderVars = (Fxu_Var *)0x0;
    pFVar6 = &pFVar9->lLits;
    ppFVar11 = ppFVar1;
    while (pFVar2 = pFVar6->pHead, pFVar13 = pFVar2, pFVar2 != (Fxu_Lit *)0x0) {
      while (pFVar13 = pFVar13->pHPrev, pFVar13 != (Fxu_Lit *)0x0) {
        pFVar10 = pFVar13->pVar;
        if (pFVar10->pOrder == (Fxu_Var *)0x0) {
          *ppFVar11 = pFVar10;
          ppFVar11 = &pFVar10->pOrder;
          p->ppTailVars = ppFVar11;
          pFVar10->pOrder = (Fxu_Var *)0x1;
        }
      }
      pFVar6 = (Fxu_ListLit *)&pFVar2->pVNext;
    }
    pFVar10 = *ppFVar1;
    if (pFVar10 != (Fxu_Var *)0x0) {
      for (; pFVar10 != (Fxu_Var *)0x1; pFVar10 = pFVar10->pOrder) {
        iVar3 = Fxu_SingleCountCoincidence(p_01,pFVar10,pFVar9);
        if (iVar3 < 1) {
          __assert_fail("Coin > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSingle.c"
                        ,0x9d,
                        "void Fxu_MatrixComputeSinglesOneCollect(Fxu_Matrix *, Fxu_Var *, Vec_Ptr_t *)"
                       );
        }
        if (p->nWeightLimit <= iVar3 + -2) {
          Vec_PtrPush((Vec_Ptr_t *)p_00,pFVar10);
          Vec_PtrPush((Vec_Ptr_t *)p_00,pFVar9);
          p_01 = p_00;
          Vec_PtrPush((Vec_Ptr_t *)p_00,(void *)(long)(iVar3 + -2));
        }
      }
    }
    p_01 = p;
    Fxu_MatrixRingVarsUnmark(p);
    pFVar15 = (Fxu_ListVar *)&pFVar9->pNext;
  }
  iVar3 = *(int *)((long)&(p_00->lCubes).pHead + 4);
  p->nSingleTotal = iVar3 / 3;
  if (nSingleMax < iVar3) {
    if (iVar3 % 3 != 0) {
      uVar4 = 0x3f;
      goto LAB_003ac19d;
    }
    pvVar7 = calloc(1,4000);
    for (iVar14 = 2; iVar14 < iVar3; iVar14 = iVar14 + 3) {
      pvVar8 = Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar14);
      lVar12 = (long)(int)pvVar8 * 4;
      if (0x3e6 < (int)pvVar8) {
        lVar12 = 0xf9c;
      }
      *(int *)((long)pvVar7 + lVar12) = *(int *)((long)pvVar7 + lVar12) + 1;
    }
    uVar4 = 999;
    iVar14 = 0;
    while ((local_40 = 0xffffffff, -1 < (int)uVar4 &&
           (iVar14 = iVar14 + *(int *)((long)pvVar7 + (ulong)uVar4 * 4), local_40 = uVar4,
           iVar14 < nSingleMax))) {
      uVar4 = uVar4 - 1;
    }
    free(pvVar7);
    i_01 = 0;
    for (iVar14 = 1; i_00 = iVar14 + 1, i_00 < iVar3; iVar14 = iVar14 + 3) {
      pvVar7 = Vec_PtrEntry((Vec_Ptr_t *)p_00,i_00);
      if ((int)local_40 <= (int)pvVar7) {
        pvVar7 = Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar14 + -1);
        Vec_PtrWriteEntry((Vec_Ptr_t *)p_00,i_01,pvVar7);
        i = i_01 + 2;
        pvVar7 = Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar14);
        Vec_PtrWriteEntry((Vec_Ptr_t *)p_00,i_01 + 1,pvVar7);
        i_01 = i_01 + 3;
        pvVar7 = Vec_PtrEntry((Vec_Ptr_t *)p_00,i_00);
        Vec_PtrWriteEntry((Vec_Ptr_t *)p_00,i,pvVar7);
        if (i_01 / 3 == nSingleMax) break;
      }
    }
    if (iVar3 < i_01) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    *(int *)((long)&(p_00->lCubes).pHead + 4) = i_01;
    p->nWeightLimit = local_40;
    iVar3 = i_01;
  }
  if (iVar3 % 3 == 0) {
    for (iVar14 = 0; iVar14 < iVar3; iVar14 = iVar14 + 3) {
      pFVar9 = (Fxu_Var *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar14);
      pFVar10 = (Fxu_Var *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar14 + 1);
      pvVar7 = Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar14 + 2);
      Fxu_MatrixAddSingle(p,pFVar9,pFVar10,(int)pvVar7);
    }
    free((p_00->lCubes).pTail);
    free(p_00);
    return;
  }
  uVar4 = 0x66;
LAB_003ac19d:
  __assert_fail("Vec_PtrSize(vSingles) % 3 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSingle.c"
                ,uVar4,"void Fxu_MatrixComputeSingles(Fxu_Matrix *, int, int)");
}

Assistant:

void Fxu_MatrixComputeSingles( Fxu_Matrix * p, int fUse0, int nSingleMax )
{
    Fxu_Var * pVar;
    Vec_Ptr_t * vSingles;
    int i, k;
    // set the weight limit
    p->nWeightLimit = 1 - fUse0;
    // iterate through columns in the matrix and collect single-cube divisors
    vSingles = Vec_PtrAlloc( 10000 );
    Fxu_MatrixForEachVariable( p, pVar )
        Fxu_MatrixComputeSinglesOneCollect( p, pVar, vSingles );
    p->nSingleTotal = Vec_PtrSize(vSingles) / 3;
    // check if divisors should be filtered
    if ( Vec_PtrSize(vSingles) > nSingleMax )
    {
        int * pWeigtCounts, nDivCount, Weight, i, c;;
        assert( Vec_PtrSize(vSingles) % 3 == 0 );
        // count how many divisors have the given weight
        pWeigtCounts = ABC_ALLOC( int, 1000 );
        memset( pWeigtCounts, 0, sizeof(int) * 1000 );
        for ( i = 2; i < Vec_PtrSize(vSingles); i += 3 )
        {
            Weight = (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles, i);
            if ( Weight >= 999 )
                pWeigtCounts[999]++;
            else
                pWeigtCounts[Weight]++;
        }
        // select the bound on the weight (above this bound, singles will be included)
        nDivCount = 0;
        for ( c = 999; c >= 0; c-- )
        {
            nDivCount += pWeigtCounts[c];
            if ( nDivCount >= nSingleMax )
                break;
        }
        ABC_FREE( pWeigtCounts );
        // collect singles with the given costs
        k = 0;
        for ( i = 2; i < Vec_PtrSize(vSingles); i += 3 )
        {
            Weight = (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles, i);
            if ( Weight < c )
                continue;
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i-2) );
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i-1) );
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i) );
            if ( k/3 == nSingleMax )
                break;
        }
        Vec_PtrShrink( vSingles, k );
        // adjust the weight limit
        p->nWeightLimit = c;
    }
    // collect the selected divisors
    assert( Vec_PtrSize(vSingles) % 3 == 0 );
    for ( i = 0; i < Vec_PtrSize(vSingles); i += 3 )
    {
        Fxu_MatrixAddSingle( p, 
            (Fxu_Var *)Vec_PtrEntry(vSingles,i), 
            (Fxu_Var *)Vec_PtrEntry(vSingles,i+1), 
            (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles,i+2) );
    }
    Vec_PtrFree( vSingles );
}